

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall
Lodtalk::StackInterpreter::interpretPrimitive(StackInterpreter *this,int primitiveIndex)

{
  PrimitiveFunction primitive;
  
  if (primitiveIndex == 0x100) {
    puts("TODO: Find the named primitive");
    return;
  }
  primitive = VMContext::findPrimitive(this->context,primitiveIndex);
  if (primitive != (PrimitiveFunction)0x0) {
    callPrimitiveHere(this,primitive);
    return;
  }
  printf("unimplemented primitive: %d\n",(ulong)(uint)primitiveIndex);
  return;
}

Assistant:

void interpretPrimitive(int primitiveIndex)
    {
        // Use a switch for the fast primitives.
        switch(primitiveIndex)
        {
        case 256:
            return findAndCallNamedPrimitive();
        default:
            // Go through the slow route.
            break;
        }

        // Call the normal primitive
        auto primitive = context->findPrimitive(primitiveIndex);
        if(primitive)
        {
            return callPrimitiveHere(primitive);
        }

        printf("unimplemented primitive: %d\n", primitiveIndex);
    }